

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint32_t uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double t2;
  double pi;
  double t1;
  long m;
  long lStack_38;
  uint seed;
  uint64_t count;
  double y;
  double x;
  long n;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  n = (long)argv;
  argv_local._0_4_ = argc;
  if (1 < argc) {
    t1 = (double)atol(argv[1]);
    lStack_38 = 0;
    m._4_4_ = 0x12d591;
    x = t1;
    dVar3 = wctime();
    while (dVar2 = (double)((long)t1 + -1), t1 != 0.0) {
      uVar1 = rng((uint32_t *)((long)&m + 4),0x7fffffff);
      y = (double)uVar1 / 2147483647.0;
      uVar1 = rng((uint32_t *)((long)&m + 4),0x7fffffff);
      count = (uint64_t)((double)uVar1 / 2147483647.0);
      dVar4 = sqrt(y * y + (double)count * (double)count);
      t1 = dVar2;
      if (dVar4 < 1.0) {
        lStack_38 = lStack_38 + 1;
      }
    }
    auVar5._8_4_ = (int)((ulong)lStack_38 >> 0x20);
    auVar5._0_8_ = lStack_38;
    auVar5._12_4_ = 0x45300000;
    dVar2 = (((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lStack_38) - 4503599627370496.0)) * 4.0) /
            (double)(long)x;
    dVar4 = wctime();
    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n",dVar2,
           ABS(3.141592653589793 - dVar2) / 3.141592653589793,x);
    printf("Time: %f\n",dVar4 - dVar3);
    return 0;
  }
  usage(*argv);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc <= 1) {
        usage(argv[0]);
        exit(1);
    }

    const long n = atol(argv[1]);

    double x, y;
    uint64_t count = 0;
    unsigned int seed = 1234321;
    long m = n;

    double t1 = wctime();
    while (m--) {
        x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        if (sqrt(x*x+y*y) < 1.0) ++count;
    }
    double pi = 4.0*(double)count/n;
    double t2 = wctime();

    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n", n, pi, fabs(M_PI-pi)/M_PI);
    printf("Time: %f\n", t2-t1);

    return 0;
}